

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo::_InternalSerialize
          (GeneratedCodeInfo *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  Type *this_00;
  uint uVar4;
  uint uVar5;
  int index;
  uint8 *puVar6;
  uint8 *puVar7;
  
  iVar1 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
                          (&(this->annotation_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar4 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar4 < 0x80) {
        target[1] = (byte)uVar4;
        puVar6 = target + 2;
      }
      else {
        target[1] = (byte)uVar4 | 0x80;
        if (uVar4 < 0x4000) {
          target[2] = (uint8)(uVar4 >> 7);
          puVar6 = target + 3;
        }
        else {
          puVar6 = target + 3;
          uVar4 = uVar4 >> 7;
          do {
            puVar7 = puVar6;
            puVar7[-1] = (byte)uVar4 | 0x80;
            uVar5 = uVar4 >> 7;
            puVar6 = puVar7 + 1;
            bVar3 = 0x3fff < uVar4;
            uVar4 = uVar5;
          } while (bVar3);
          *puVar7 = (uint8)uVar5;
        }
      }
      target = GeneratedCodeInfo_Annotation::_InternalSerialize(this_00,puVar6,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  pvVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar6 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8),target,stream)
    ;
    return puVar6;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_annotation_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_annotation(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo)
  return target;
}